

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space2.cpp
# Opt level: O2

void keyboard_controls_proc(Am_Object *cmd)

{
  char cVar1;
  bool bVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  Am_Value *pAVar6;
  ostream *poVar7;
  Am_Object *pAVar8;
  ulong uVar9;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Input_Char c;
  Am_Object inter;
  
  Am_Object::Get_Owner(&inter,(Am_Slot_Flags)cmd);
  pAVar6 = (Am_Value *)Am_Object::Get((ushort)&inter,0x11b);
  Am_Input_Char::Am_Input_Char(&c,pAVar6);
  cVar1 = Am_Input_Char::As_Char();
  switch(cVar1) {
  case 'i':
switchD_00103f27_caseD_69:
    if (num_bullets < 2) {
      pAVar6 = (Am_Value *)Am_Object::Get(0x92d0,0x69);
      bVar2 = Am_Value::operator_cast_to_bool(pAVar6);
      if (bVar2) {
        Am_Object::Get_Owner(&local_30,0x1092d0);
        Am_Object::Create((char *)&local_28);
        pAVar6 = (Am_Value *)Am_Object::Get(0x92d0,100);
        iVar4 = Am_Value::operator_cast_to_int(pAVar6);
        pAVar6 = (Am_Value *)Am_Object::Get(0x92d0,0x66);
        iVar5 = Am_Value::operator_cast_to_int(pAVar6);
        uVar3 = Am_Object::Set((ushort)&local_28,100,(ulong)(uint)(iVar4 + iVar5 / 2));
        pAVar6 = (Am_Value *)Am_Object::Get(0x92d8,0x67);
        iVar4 = Am_Value::operator_cast_to_int(pAVar6);
        pAVar8 = (Am_Object *)Am_Object::Set(uVar3,0x65,(ulong)(uint)-iVar4);
        Am_Object::Am_Object(&local_20,pAVar8);
        Am_Object::Add_Part((Am_Object_Data *)&local_30,SUB81(&local_20,0),1);
        Am_Object::~Am_Object(&local_20);
        Am_Object::~Am_Object(&local_28);
        Am_Object::~Am_Object(&local_30);
        num_bullets = num_bullets + 1;
      }
    }
    break;
  case 'j':
    Am_Object::Set(0x92d0,100,10);
    break;
  case 'k':
  case 'm':
  case 'n':
  case 'o':
  case 'p':
switchD_00103f27_caseD_6b:
    uVar9 = Am_Object::Get(0x92d0,100);
    Am_Object::Set(0x92d0,(Am_Value *)0x64,uVar9);
    break;
  case 'l':
    Am_Object::Get_Owner(&local_30,0x1092d0);
    pAVar6 = (Am_Value *)Am_Object::Get((ushort)&local_30,0x66);
    iVar4 = Am_Value::operator_cast_to_int(pAVar6);
    pAVar6 = (Am_Value *)Am_Object::Get(0x92d0,0x66);
    iVar5 = Am_Value::operator_cast_to_int(pAVar6);
    Am_Object::Set(0x92d0,100,(ulong)((iVar4 - iVar5) - 10));
    Am_Object::~Am_Object(&local_30);
    break;
  case 'q':
    Am_Exit_Main_Event_Loop();
    break;
  default:
    if (cVar1 == ' ') goto switchD_00103f27_caseD_69;
    if (cVar1 != '?') goto switchD_00103f27_caseD_6b;
  case 'h':
    poVar7 = std::operator<<((ostream *)&std::cout,"q = quit\n");
    poVar7 = std::operator<<(poVar7,"p = pause (wait forever)\n");
    poVar7 = std::operator<<(poVar7,"j = move left\n");
    poVar7 = std::operator<<(poVar7,"l = move right\n");
    poVar7 = std::operator<<(poVar7,"i or space = shoot\n");
    std::endl<char,std::char_traits<char>>(poVar7);
    std::ostream::flush();
  }
  Am_Object::~Am_Object(&inter);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, keyboard_controls, (Am_Object cmd))
{
  Am_Object inter = cmd.Get_Owner();
  Am_Input_Char c = inter.Get(Am_START_CHAR);
  switch (c.As_Char()) {
  case 'p': {
    int i = 0;
    while (true) { //pause, wait forever
      i++;
    }
  }
  case 'j': // left
    Ship.Set(Am_LEFT, 10);
    break;
  case 'l': // right
    Ship.Set(Am_LEFT, (int)Ship.Get_Owner().Get(Am_WIDTH) -
                          (int)Ship.Get(Am_WIDTH) - 10);
    break;
  case ' ':
  case 'i': // shoot
    if (num_bullets < MAX_BULLETS && (bool)Ship.Get(Am_VISIBLE)) {
      Ship.Get_Owner().Add_Part(
          Bullet.Create()
              .Set(Am_LEFT,
                   (int)Ship.Get(Am_LEFT) + ((int)Ship.Get(Am_WIDTH) / 2))
              .Set(Am_TOP, -(int)Bullet.Get(Am_HEIGHT)));
      num_bullets++;
    }
    break;
  case 'q':
    Am_Exit_Main_Event_Loop();
    break;
  case '?':
  case 'h':
    cout << "q = quit\n"
         << "p = pause (wait forever)\n"
         << "j = move left\n"
         << "l = move right\n"
         << "i or space = shoot\n"
         << endl
         << flush;
    break;
  default: // stop
    // stop the ship where it is
    Ship.Set(Am_LEFT, Ship.Get(Am_LEFT));
  }
}